

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  long *pInLimit;
  long *plVar2;
  BYTE *pBVar3;
  long *plVar4;
  undefined8 *puVar5;
  U32 h;
  uint uVar6;
  BYTE *pBVar7;
  U32 *pUVar8;
  U32 *pUVar9;
  BYTE *pBVar10;
  uint uVar11;
  undefined8 uVar12;
  char cVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  size_t sVar17;
  seqDef *psVar18;
  byte bVar19;
  uint uVar20;
  U32 UVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  BYTE *litEnd;
  long *iend;
  long *plVar31;
  long *plVar32;
  long *plVar33;
  long *plVar34;
  uint local_d4;
  uint local_d0;
  BYTE *litLimit_w_1;
  BYTE *litLimit_w;
  
  pBVar7 = (ms->window).base;
  pInLimit = (long *)((long)src + srcSize);
  iVar29 = (int)pBVar7;
  iVar23 = (int)pInLimit - iVar29;
  uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar20 = (ms->window).dictLimit;
  uVar11 = iVar23 - uVar30;
  if (iVar23 - uVar20 <= uVar30) {
    uVar11 = uVar20;
  }
  if (ms->loadedDictEnd != 0) {
    uVar11 = uVar20;
  }
  plVar2 = (long *)(pBVar7 + uVar11);
  iend = (long *)((ulong)(plVar2 == (long *)src) + (long)src);
  iVar23 = (int)iend - iVar29;
  uVar24 = iVar23 - uVar30;
  if (iVar23 - uVar20 <= uVar30) {
    uVar24 = uVar20;
  }
  uVar30 = (ms->cParams).minMatch;
  if (ms->loadedDictEnd != 0) {
    uVar24 = uVar20;
  }
  pUVar8 = ms->hashTable;
  uVar24 = iVar23 - uVar24;
  h = (ms->cParams).hashLog;
  pUVar9 = ms->chainTable;
  uVar20 = (ms->cParams).chainLog;
  uVar26 = rep[1];
  local_d0 = uVar26;
  if (uVar24 < uVar26) {
    local_d0 = 0;
  }
  uVar6 = *rep;
  local_d4 = 0;
  if (uVar6 <= uVar24) {
    local_d4 = uVar6;
  }
  plVar4 = (long *)((long)src + (srcSize - 8));
  cVar13 = (char)uVar20;
  if (uVar30 == 5) {
    bVar19 = 0x40 - cVar13;
    plVar1 = pInLimit + -4;
LAB_00146af2:
    if ((long *)((long)iend + 1U) <= plVar4) {
      if ((h < 0x21) && (sVar15 = ZSTD_hash8Ptr(iend,h), uVar20 < 0x21)) {
        uVar28 = (ulong)pUVar8[sVar15];
        plVar33 = (long *)(pBVar7 + uVar28);
        plVar32 = iend + 0x20;
        uVar27 = 1;
        plVar34 = (long *)((long)iend + 1U);
        while( true ) {
          uVar16 = (ulong)(*iend * -0x30e4432345000000) >> (bVar19 & 0x3f);
          uVar30 = pUVar9[uVar16];
          iVar23 = (int)iend;
          UVar21 = iVar23 - iVar29;
          pUVar9[uVar16] = UVar21;
          pUVar8[sVar15] = UVar21;
          if ((local_d4 != 0) &&
             (*(int *)((long)iend + -(ulong)local_d4 + 1) == *(int *)((long)iend + 1))) break;
          sVar15 = ZSTD_hash8Ptr(plVar34,h);
          iVar25 = (int)plVar34;
          if ((uVar11 < (uint)uVar28) && (*plVar33 == *iend)) {
            sVar17 = ZSTD_count((BYTE *)(iend + 1),(BYTE *)(plVar33 + 1),(BYTE *)pInLimit);
            uVar28 = sVar17 + 8;
            uVar30 = iVar23 - (int)plVar33;
            for (; ((plVar2 < plVar33 && (src < iend)) &&
                   (*(char *)((long)iend + -1) == *(char *)((long)plVar33 + -1)));
                iend = (long *)((long)iend + -1)) {
              plVar33 = (long *)((long)plVar33 + -1);
              uVar28 = uVar28 + 1;
            }
            goto LAB_00146e93;
          }
          uVar28 = (ulong)pUVar8[sVar15];
          plVar33 = (long *)(pBVar7 + uVar28);
          if ((uVar11 < uVar30) &&
             (plVar31 = (long *)(pBVar7 + uVar30), (int)*plVar31 == (int)*iend)) goto LAB_00146dda;
          if (plVar32 <= plVar34) {
            uVar27 = uVar27 + 1;
            plVar32 = plVar32 + 0x20;
          }
          plVar31 = (long *)(uVar27 + (long)plVar34);
          iend = plVar34;
          plVar34 = plVar31;
          if (plVar4 < plVar31) goto LAB_001479fe;
        }
        sVar15 = ZSTD_count((BYTE *)((long)iend + 5),(BYTE *)((long)iend + -(ulong)local_d4 + 5),
                            (BYTE *)pInLimit);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00147aa9;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
        iend = (long *)((long)iend + 1);
        uVar27 = (long)iend - (long)src;
        plVar32 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27))
        goto LAB_00147ac8;
        if (pInLimit < iend) goto LAB_00147ae7;
        if (plVar1 < iend) {
          ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar1);
          goto LAB_00146cc9;
        }
        lVar22 = *(long *)((long)src + 8);
        *plVar32 = *src;
        plVar32[1] = lVar22;
        pBVar10 = seqStore->lit;
        if (uVar27 < 0x11) {
          seqStore->lit = pBVar10 + uVar27;
          goto LAB_00146fd5;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - ((long)src + 0x10))))
        goto LAB_00147b82;
        lVar22 = *(long *)((long)src + 0x18);
        *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar10 + 0x18) = lVar22;
        if (0x20 < (long)uVar27) {
          lVar22 = 0;
          do {
            puVar5 = (undefined8 *)((long)src + lVar22 + 0x20);
            uVar12 = puVar5[1];
            pBVar3 = pBVar10 + lVar22 + 0x20;
            *(undefined8 *)pBVar3 = *puVar5;
            *(undefined8 *)(pBVar3 + 8) = uVar12;
            puVar5 = (undefined8 *)((long)src + lVar22 + 0x30);
            uVar12 = puVar5[1];
            *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
            *(undefined8 *)(pBVar3 + 0x18) = uVar12;
            lVar22 = lVar22 + 0x20;
          } while (pBVar3 + 0x20 < pBVar10 + uVar27);
        }
LAB_00146cc9:
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b63;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_00146fd5:
        uVar28 = sVar15 + 4;
        psVar18 = seqStore->sequences;
        psVar18->litLength = (U16)uVar27;
        psVar18->offBase = 1;
        if (2 < uVar28) {
          uVar27 = sVar15 + 1;
          if (uVar27 < 0x10000) goto LAB_0014707f;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0014705a;
          goto LAB_00147b06;
        }
        goto LAB_00147a6b;
      }
      goto LAB_00147b25;
    }
    goto LAB_001479fe;
  }
  if (uVar30 == 6) {
    plVar1 = pInLimit + -4;
LAB_00146348:
    if ((long *)((long)iend + 1U) <= plVar4) {
      if ((h < 0x21) && (sVar15 = ZSTD_hash8Ptr(iend,h), uVar20 < 0x21)) {
        uVar28 = (ulong)pUVar8[sVar15];
        plVar34 = (long *)(pBVar7 + uVar28);
        plVar33 = iend + 0x20;
        uVar27 = 1;
        plVar32 = (long *)((long)iend + 1U);
        while( true ) {
          sVar17 = ZSTD_hash6Ptr(iend,uVar20);
          uVar30 = pUVar9[sVar17];
          iVar23 = (int)iend;
          UVar21 = iVar23 - iVar29;
          pUVar9[sVar17] = UVar21;
          pUVar8[sVar15] = UVar21;
          if ((local_d4 != 0) &&
             (*(int *)((long)iend + -(ulong)local_d4 + 1) == *(int *)((long)iend + 1))) break;
          sVar15 = ZSTD_hash8Ptr(plVar32,h);
          iVar25 = (int)plVar32;
          if ((uVar11 < (uint)uVar28) && (*plVar34 == *iend)) {
            sVar17 = ZSTD_count((BYTE *)(iend + 1),(BYTE *)(plVar34 + 1),(BYTE *)pInLimit);
            uVar28 = sVar17 + 8;
            uVar30 = iVar23 - (int)plVar34;
            for (; ((plVar2 < plVar34 && (src < iend)) &&
                   (*(char *)((long)iend + -1) == *(char *)((long)plVar34 + -1)));
                iend = (long *)((long)iend + -1)) {
              plVar34 = (long *)((long)plVar34 + -1);
              uVar28 = uVar28 + 1;
            }
            goto LAB_001466fa;
          }
          uVar28 = (ulong)pUVar8[sVar15];
          plVar34 = (long *)(pBVar7 + uVar28);
          if ((uVar11 < uVar30) &&
             (plVar31 = (long *)(pBVar7 + uVar30), (int)*plVar31 == (int)*iend)) goto LAB_0014663b;
          if (plVar33 <= plVar32) {
            uVar27 = uVar27 + 1;
            plVar33 = plVar33 + 0x20;
          }
          plVar31 = (long *)((long)plVar32 + uVar27);
          iend = plVar32;
          plVar32 = plVar31;
          if (plVar4 < plVar31) goto LAB_001479fe;
        }
        sVar15 = ZSTD_count((BYTE *)((long)iend + 5),(BYTE *)((long)iend + -(ulong)local_d4 + 5),
                            (BYTE *)pInLimit);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00147aa9;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
        iend = (long *)((long)iend + 1);
        uVar27 = (long)iend - (long)src;
        plVar32 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27))
        goto LAB_00147ac8;
        if (pInLimit < iend) goto LAB_00147ae7;
        if (plVar1 < iend) {
          ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar1);
          goto LAB_00146523;
        }
        lVar22 = *(long *)((long)src + 8);
        *plVar32 = *src;
        plVar32[1] = lVar22;
        pBVar10 = seqStore->lit;
        if (uVar27 < 0x11) {
          seqStore->lit = pBVar10 + uVar27;
          goto LAB_00146841;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - ((long)src + 0x10))))
        goto LAB_00147b82;
        lVar22 = *(long *)((long)src + 0x18);
        *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar10 + 0x18) = lVar22;
        if (0x20 < (long)uVar27) {
          lVar22 = 0;
          do {
            puVar5 = (undefined8 *)((long)src + lVar22 + 0x20);
            uVar12 = puVar5[1];
            pBVar3 = pBVar10 + lVar22 + 0x20;
            *(undefined8 *)pBVar3 = *puVar5;
            *(undefined8 *)(pBVar3 + 8) = uVar12;
            puVar5 = (undefined8 *)((long)src + lVar22 + 0x30);
            uVar12 = puVar5[1];
            *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
            *(undefined8 *)(pBVar3 + 0x18) = uVar12;
            lVar22 = lVar22 + 0x20;
          } while (pBVar3 + 0x20 < pBVar10 + uVar27);
        }
LAB_00146523:
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b63;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_00146841:
        uVar28 = sVar15 + 4;
        psVar18 = seqStore->sequences;
        psVar18->litLength = (U16)uVar27;
        psVar18->offBase = 1;
        if (2 < uVar28) {
          uVar27 = sVar15 + 1;
          if (uVar27 < 0x10000) goto LAB_001468f0;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001468cb;
          goto LAB_00147b06;
        }
        goto LAB_00147a6b;
      }
      goto LAB_00147b25;
    }
    goto LAB_001479fe;
  }
  if (uVar30 != 7) {
    bVar19 = 0x20 - cVar13;
    plVar1 = pInLimit + -4;
LAB_0014728e:
    if ((long *)((long)iend + 1U) <= plVar4) {
      if ((h < 0x21) && (sVar15 = ZSTD_hash8Ptr(iend,h), uVar20 < 0x21)) {
        uVar28 = (ulong)pUVar8[sVar15];
        plVar33 = (long *)(pBVar7 + uVar28);
        plVar32 = iend + 0x20;
        uVar27 = 1;
        plVar34 = (long *)((long)iend + 1U);
        while( true ) {
          plVar31 = plVar34;
          uVar14 = (uint)((int)*iend * -0x61c8864f) >> (bVar19 & 0x1f);
          uVar30 = pUVar9[uVar14];
          iVar23 = (int)iend;
          UVar21 = iVar23 - iVar29;
          pUVar9[uVar14] = UVar21;
          pUVar8[sVar15] = UVar21;
          if ((local_d4 != 0) &&
             (*(int *)((long)iend + -(ulong)local_d4 + 1) == *(int *)((long)iend + 1))) break;
          sVar15 = ZSTD_hash8Ptr(plVar31,h);
          iVar25 = (int)plVar31;
          if ((uVar11 < (uint)uVar28) && (*plVar33 == *iend)) {
            sVar17 = ZSTD_count((BYTE *)(iend + 1),(BYTE *)(plVar33 + 1),(BYTE *)pInLimit);
            uVar28 = sVar17 + 8;
            uVar30 = iVar23 - (int)plVar33;
            for (; ((plVar2 < plVar33 && (src < iend)) &&
                   (*(char *)((long)iend + -1) == *(char *)((long)plVar33 + -1)));
                iend = (long *)((long)iend + -1)) {
              plVar33 = (long *)((long)plVar33 + -1);
              uVar28 = uVar28 + 1;
            }
            goto LAB_0014762f;
          }
          uVar28 = (ulong)pUVar8[sVar15];
          plVar33 = (long *)(pBVar7 + uVar28);
          if ((uVar11 < uVar30) &&
             (plVar34 = (long *)(pBVar7 + uVar30), (int)*plVar34 == (int)*iend)) goto LAB_0014756b;
          if (plVar32 <= plVar31) {
            uVar27 = uVar27 + 1;
            plVar32 = plVar32 + 0x20;
          }
          plVar34 = (long *)((long)plVar31 + uVar27);
          iend = plVar31;
          if (plVar4 < (long *)((long)plVar31 + uVar27)) goto LAB_001479fe;
        }
        sVar15 = ZSTD_count((BYTE *)((long)iend + 5),(BYTE *)((long)iend + -(ulong)local_d4 + 5),
                            (BYTE *)pInLimit);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00147aa9;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
        iend = (long *)((long)iend + 1);
        uVar27 = (long)iend - (long)src;
        plVar32 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27))
        goto LAB_00147ac8;
        if (pInLimit < iend) goto LAB_00147ae7;
        if (plVar1 < iend) {
          ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar1);
          goto LAB_0014745d;
        }
        lVar22 = *(long *)((long)src + 8);
        *plVar32 = *src;
        plVar32[1] = lVar22;
        pBVar10 = seqStore->lit;
        if (uVar27 < 0x11) {
          seqStore->lit = pBVar10 + uVar27;
          goto LAB_00147767;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - ((long)src + 0x10))))
        goto LAB_00147b82;
        lVar22 = *(long *)((long)src + 0x18);
        *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
        *(long *)(pBVar10 + 0x18) = lVar22;
        if (0x20 < (long)uVar27) {
          lVar22 = 0;
          do {
            puVar5 = (undefined8 *)((long)src + lVar22 + 0x20);
            uVar12 = puVar5[1];
            pBVar3 = pBVar10 + lVar22 + 0x20;
            *(undefined8 *)pBVar3 = *puVar5;
            *(undefined8 *)(pBVar3 + 8) = uVar12;
            puVar5 = (undefined8 *)((long)src + lVar22 + 0x30);
            uVar12 = puVar5[1];
            *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
            *(undefined8 *)(pBVar3 + 0x18) = uVar12;
            lVar22 = lVar22 + 0x20;
          } while (pBVar3 + 0x20 < pBVar10 + uVar27);
        }
LAB_0014745d:
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b63;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_00147767:
        uVar28 = sVar15 + 4;
        psVar18 = seqStore->sequences;
        psVar18->litLength = (U16)uVar27;
        psVar18->offBase = 1;
        if (2 < uVar28) {
          uVar27 = sVar15 + 1;
          if (uVar27 < 0x10000) goto LAB_00147813;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001477ef;
          goto LAB_00147b06;
        }
        goto LAB_00147a6b;
      }
      goto LAB_00147b25;
    }
    goto LAB_001479fe;
  }
  bVar19 = 0x40 - cVar13;
  plVar1 = pInLimit + -4;
LAB_00145bc2:
  if (plVar4 < (long *)((long)iend + 1U)) {
LAB_001479fe:
    if (uVar26 <= uVar24) {
      uVar26 = 0;
    }
    uVar20 = uVar26;
    if (local_d4 != 0) {
      uVar20 = uVar6;
    }
    if (uVar6 <= uVar24) {
      uVar20 = uVar26;
      uVar6 = 0;
    }
    if (local_d4 != 0) {
      uVar6 = local_d4;
    }
    if (local_d0 != 0) {
      uVar20 = local_d0;
    }
    *rep = uVar6;
    rep[1] = uVar20;
    return (long)pInLimit - (long)src;
  }
  if ((0x20 < h) || (sVar15 = ZSTD_hash8Ptr(iend,h), 0x20 < uVar20)) {
LAB_00147b25:
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  uVar28 = (ulong)pUVar8[sVar15];
  plVar33 = (long *)(pBVar7 + uVar28);
  plVar32 = iend + 0x20;
  uVar27 = 1;
  plVar34 = (long *)((long)iend + 1U);
  while( true ) {
    plVar31 = plVar34;
    uVar16 = (ulong)(*iend * -0x30e44323405a9d00) >> (bVar19 & 0x3f);
    uVar30 = pUVar9[uVar16];
    iVar23 = (int)iend;
    UVar21 = iVar23 - iVar29;
    pUVar9[uVar16] = UVar21;
    pUVar8[sVar15] = UVar21;
    if ((local_d4 != 0) && (*(int *)((long)iend + -(ulong)local_d4 + 1) == *(int *)((long)iend + 1))
       ) break;
    sVar15 = ZSTD_hash8Ptr(plVar31,h);
    iVar25 = (int)plVar31;
    if ((uVar11 < (uint)uVar28) && (*plVar33 == *iend)) {
      sVar17 = ZSTD_count((BYTE *)(iend + 1),(BYTE *)(plVar33 + 1),(BYTE *)pInLimit);
      uVar28 = sVar17 + 8;
      uVar30 = iVar23 - (int)plVar33;
      for (; ((plVar2 < plVar33 && (src < iend)) &&
             (*(char *)((long)iend + -1) == *(char *)((long)plVar33 + -1)));
          iend = (long *)((long)iend + -1)) {
        plVar33 = (long *)((long)plVar33 + -1);
        uVar28 = uVar28 + 1;
      }
      goto LAB_00145f6a;
    }
    uVar28 = (ulong)pUVar8[sVar15];
    plVar33 = (long *)(pBVar7 + uVar28);
    if ((uVar11 < uVar30) && (plVar34 = (long *)(pBVar7 + uVar30), (int)*plVar34 == (int)*iend))
    goto LAB_00145ea6;
    if (plVar32 <= plVar31) {
      uVar27 = uVar27 + 1;
      plVar32 = plVar32 + 0x20;
    }
    plVar34 = (long *)((long)plVar31 + uVar27);
    iend = plVar31;
    if (plVar4 < (long *)((long)plVar31 + uVar27)) goto LAB_001479fe;
  }
  sVar15 = ZSTD_count((BYTE *)((long)iend + 5),(BYTE *)((long)iend + -(ulong)local_d4 + 5),
                      (BYTE *)pInLimit);
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00147aa9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
  iend = (long *)((long)iend + 1);
  uVar27 = (long)iend - (long)src;
  plVar32 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27)) goto LAB_00147ac8;
  if (pInLimit < iend) goto LAB_00147ae7;
  if (plVar1 < iend) {
    ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar1);
    goto LAB_00145d98;
  }
  lVar22 = *(long *)((long)src + 8);
  *plVar32 = *src;
  plVar32[1] = lVar22;
  pBVar10 = seqStore->lit;
  if (uVar27 < 0x11) {
    seqStore->lit = pBVar10 + uVar27;
    goto LAB_001460a5;
  }
  if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - ((long)src + 0x10))))
  goto LAB_00147b82;
  lVar22 = *(long *)((long)src + 0x18);
  *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
  *(long *)(pBVar10 + 0x18) = lVar22;
  if (0x20 < (long)uVar27) {
    lVar22 = 0;
    do {
      puVar5 = (undefined8 *)((long)src + lVar22 + 0x20);
      uVar12 = puVar5[1];
      pBVar3 = pBVar10 + lVar22 + 0x20;
      *(undefined8 *)pBVar3 = *puVar5;
      *(undefined8 *)(pBVar3 + 8) = uVar12;
      puVar5 = (undefined8 *)((long)src + lVar22 + 0x30);
      uVar12 = puVar5[1];
      *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
      *(undefined8 *)(pBVar3 + 0x18) = uVar12;
      lVar22 = lVar22 + 0x20;
    } while (pBVar3 + 0x20 < pBVar10 + uVar27);
  }
LAB_00145d98:
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b63;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001460a5:
  uVar28 = sVar15 + 4;
  psVar18 = seqStore->sequences;
  psVar18->litLength = (U16)uVar27;
  psVar18->offBase = 1;
  if (2 < uVar28) {
    uVar27 = sVar15 + 1;
    if (uVar27 < 0x10000) goto LAB_00146151;
    if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0014612d;
LAB_00147b06:
    __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x46ad,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  goto LAB_00147a6b;
LAB_00146dda:
  if ((uVar11 < pUVar8[sVar15]) && (*plVar33 == *plVar34)) {
    sVar17 = ZSTD_count((BYTE *)(plVar34 + 1),(BYTE *)(plVar33 + 1),(BYTE *)pInLimit);
    uVar28 = sVar17 + 8;
    uVar30 = iVar25 - (int)plVar33;
    for (; ((iend = plVar34, plVar2 < plVar33 && (src < plVar34)) &&
           (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
        plVar34 = (long *)((long)plVar34 + -1)) {
      plVar33 = (long *)((long)plVar33 + -1);
      uVar28 = uVar28 + 1;
    }
  }
  else {
    sVar17 = ZSTD_count((BYTE *)((long)iend + 4),(BYTE *)((long)plVar31 + 4),(BYTE *)pInLimit);
    uVar28 = sVar17 + 4;
    uVar30 = iVar23 - (int)plVar31;
    for (; ((plVar2 < plVar31 && (src < iend)) &&
           (*(char *)((long)iend + -1) == *(char *)((long)plVar31 + -1)));
        iend = (long *)((long)iend + -1)) {
      plVar31 = (long *)((long)plVar31 + -1);
      uVar28 = uVar28 + 1;
    }
  }
LAB_00146e93:
  if (uVar27 < 4) {
    pUVar8[sVar15] = iVar25 - iVar29;
  }
  if (uVar30 == 0) goto LAB_00147b44;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00147aa9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
  uVar27 = (long)iend - (long)src;
  plVar32 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27)) goto LAB_00147ac8;
  if (pInLimit < iend) goto LAB_00147ae7;
  if (plVar1 < iend) {
    ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar1);
  }
  else {
    lVar22 = *(long *)((long)src + 8);
    *plVar32 = *src;
    plVar32[1] = lVar22;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_0014701d;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - ((long)src + 0x10))))
    goto LAB_00147b82;
    lVar22 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar22;
    if (0x20 < (long)uVar27) {
      lVar22 = 0;
      do {
        puVar5 = (undefined8 *)((long)src + lVar22 + 0x20);
        uVar12 = puVar5[1];
        pBVar3 = pBVar10 + lVar22 + 0x20;
        *(undefined8 *)pBVar3 = *puVar5;
        *(undefined8 *)(pBVar3 + 8) = uVar12;
        puVar5 = (undefined8 *)((long)src + lVar22 + 0x30);
        uVar12 = puVar5[1];
        *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
        *(undefined8 *)(pBVar3 + 0x18) = uVar12;
        lVar22 = lVar22 + 0x20;
      } while (pBVar3 + 0x20 < pBVar10 + uVar27);
    }
  }
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b63;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0014701d:
  psVar18 = seqStore->sequences;
  psVar18->litLength = (U16)uVar27;
  psVar18->offBase = uVar30 + 3;
  if (uVar28 < 3) goto LAB_00147a6b;
  uVar27 = uVar28 - 3;
  if (uVar27 < 0x10000) {
    local_d0 = local_d4;
    local_d4 = uVar30;
  }
  else {
    local_d0 = local_d4;
    local_d4 = uVar30;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b06;
LAB_0014705a:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0014707f:
  iend = (long *)((long)iend + uVar28);
  psVar18->mlBase = (U16)uVar27;
  seqStore->sequences = psVar18 + 1;
  src = iend;
  if (iend <= plVar4) {
    uVar30 = UVar21 + 2;
    sVar15 = ZSTD_hash8Ptr(pBVar7 + uVar30,h);
    pUVar8[sVar15] = uVar30;
    sVar15 = ZSTD_hash8Ptr((void *)((long)iend + -2),h);
    pUVar8[sVar15] = (int)(void *)((long)iend + -2) - iVar29;
    pUVar9[(ulong)(*(long *)(pBVar7 + uVar30) * -0x30e4432345000000) >> (bVar19 & 0x3f)] = uVar30;
    pUVar9[(ulong)(*(long *)((long)iend + -1) * -0x30e4432345000000) >> (bVar19 & 0x3f)] =
         ((int)iend + -1) - iVar29;
    uVar30 = local_d0;
    for (; local_d0 = uVar30, src = iend, iend <= plVar4; iend = (long *)((long)iend + sVar15 + 4))
    {
      if ((local_d0 == 0) || ((int)*iend != *(int *)((long)iend - (ulong)local_d0))) break;
      sVar15 = ZSTD_count((BYTE *)((long)iend + 4),(BYTE *)((long)iend + (4 - (ulong)local_d0)),
                          (BYTE *)pInLimit);
      UVar21 = (int)iend - iVar29;
      pUVar9[(ulong)(*iend * -0x30e4432345000000) >> (bVar19 & 0x3f)] = UVar21;
      sVar17 = ZSTD_hash8Ptr(iend,h);
      pUVar8[sVar17] = UVar21;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00147aa9;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
      plVar32 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar32) goto LAB_00147ac8;
      if (pInLimit < iend) goto LAB_00147ae7;
      if (plVar1 < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)iend,(BYTE *)iend,(BYTE *)plVar1);
      }
      else {
        lVar22 = iend[1];
        *plVar32 = *iend;
        plVar32[1] = lVar22;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (sVar15 + 4 < 3) goto LAB_00147a6b;
      if (0xffff < sVar15 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b06;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(sVar15 + 1);
      seqStore->sequences = psVar18 + 1;
      uVar30 = local_d4;
      local_d4 = local_d0;
    }
  }
  goto LAB_00146af2;
LAB_0014663b:
  if ((uVar11 < pUVar8[sVar15]) && (*plVar34 == *plVar32)) {
    sVar17 = ZSTD_count((BYTE *)(plVar32 + 1),(BYTE *)(plVar34 + 1),(BYTE *)pInLimit);
    uVar28 = sVar17 + 8;
    uVar30 = iVar25 - (int)plVar34;
    for (; ((iend = plVar32, plVar2 < plVar34 && (src < plVar32)) &&
           (*(char *)((long)plVar32 + -1) == *(char *)((long)plVar34 + -1)));
        plVar32 = (long *)((long)plVar32 + -1)) {
      plVar34 = (long *)((long)plVar34 + -1);
      uVar28 = uVar28 + 1;
    }
  }
  else {
    sVar17 = ZSTD_count((BYTE *)((long)iend + 4),(BYTE *)((long)plVar31 + 4),(BYTE *)pInLimit);
    uVar28 = sVar17 + 4;
    uVar30 = iVar23 - (int)plVar31;
    for (; ((plVar2 < plVar31 && (src < iend)) &&
           (*(char *)((long)iend + -1) == *(char *)((long)plVar31 + -1)));
        iend = (long *)((long)iend + -1)) {
      plVar31 = (long *)((long)plVar31 + -1);
      uVar28 = uVar28 + 1;
    }
  }
LAB_001466fa:
  if (uVar27 < 4) {
    pUVar8[sVar15] = iVar25 - iVar29;
  }
  if (uVar30 == 0) goto LAB_00147b44;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00147aa9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
  uVar27 = (long)iend - (long)src;
  plVar32 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27)) goto LAB_00147ac8;
  if (pInLimit < iend) goto LAB_00147ae7;
  if (plVar1 < iend) {
    ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar1);
  }
  else {
    lVar22 = *(long *)((long)src + 8);
    *plVar32 = *src;
    plVar32[1] = lVar22;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_0014688e;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - ((long)src + 0x10))))
    goto LAB_00147b82;
    lVar22 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar22;
    if (0x20 < (long)uVar27) {
      lVar22 = 0;
      do {
        puVar5 = (undefined8 *)((long)src + lVar22 + 0x20);
        uVar12 = puVar5[1];
        pBVar3 = pBVar10 + lVar22 + 0x20;
        *(undefined8 *)pBVar3 = *puVar5;
        *(undefined8 *)(pBVar3 + 8) = uVar12;
        puVar5 = (undefined8 *)((long)src + lVar22 + 0x30);
        uVar12 = puVar5[1];
        *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
        *(undefined8 *)(pBVar3 + 0x18) = uVar12;
        lVar22 = lVar22 + 0x20;
      } while (pBVar3 + 0x20 < pBVar10 + uVar27);
    }
  }
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b63;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0014688e:
  psVar18 = seqStore->sequences;
  psVar18->litLength = (U16)uVar27;
  psVar18->offBase = uVar30 + 3;
  if (uVar28 < 3) goto LAB_00147a6b;
  uVar27 = uVar28 - 3;
  if (uVar27 < 0x10000) {
    local_d0 = local_d4;
    local_d4 = uVar30;
  }
  else {
    local_d0 = local_d4;
    local_d4 = uVar30;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b06;
LAB_001468cb:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001468f0:
  iend = (long *)((long)iend + uVar28);
  psVar18->mlBase = (U16)uVar27;
  seqStore->sequences = psVar18 + 1;
  src = iend;
  if (iend <= plVar4) {
    uVar30 = UVar21 + 2;
    sVar15 = ZSTD_hash8Ptr(pBVar7 + uVar30,h);
    pUVar8[sVar15] = uVar30;
    sVar15 = ZSTD_hash8Ptr((void *)((long)iend + -2),h);
    pUVar8[sVar15] = (int)(void *)((long)iend + -2) - iVar29;
    sVar15 = ZSTD_hash6Ptr(pBVar7 + uVar30,uVar20);
    pUVar9[sVar15] = uVar30;
    sVar15 = ZSTD_hash6Ptr((void *)((long)iend + -1),uVar20);
    pUVar9[sVar15] = (int)(void *)((long)iend + -1) - iVar29;
    uVar30 = local_d0;
    for (; local_d0 = uVar30, src = iend, iend <= plVar4; iend = (long *)((long)iend + sVar15 + 4))
    {
      if ((local_d0 == 0) || ((int)*iend != *(int *)((long)iend - (ulong)local_d0))) break;
      sVar15 = ZSTD_count((BYTE *)((long)iend + 4),(BYTE *)((long)iend + (4 - (ulong)local_d0)),
                          (BYTE *)pInLimit);
      UVar21 = (int)iend - iVar29;
      sVar17 = ZSTD_hash6Ptr(iend,uVar20);
      pUVar9[sVar17] = UVar21;
      sVar17 = ZSTD_hash8Ptr(iend,h);
      pUVar8[sVar17] = UVar21;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00147aa9;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
      plVar32 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar32) goto LAB_00147ac8;
      if (pInLimit < iend) goto LAB_00147ae7;
      if (plVar1 < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)iend,(BYTE *)iend,(BYTE *)plVar1);
      }
      else {
        lVar22 = iend[1];
        *plVar32 = *iend;
        plVar32[1] = lVar22;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (sVar15 + 4 < 3) goto LAB_00147a6b;
      if (0xffff < sVar15 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b06;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(sVar15 + 1);
      seqStore->sequences = psVar18 + 1;
      uVar30 = local_d4;
      local_d4 = local_d0;
    }
  }
  goto LAB_00146348;
LAB_0014756b:
  if ((uVar11 < pUVar8[sVar15]) && (*plVar33 == *plVar31)) {
    sVar17 = ZSTD_count((BYTE *)(plVar31 + 1),(BYTE *)(plVar33 + 1),(BYTE *)pInLimit);
    uVar28 = sVar17 + 8;
    uVar30 = iVar25 - (int)plVar33;
    for (; ((iend = plVar31, plVar2 < plVar33 && (src < plVar31)) &&
           (*(char *)((long)plVar31 + -1) == *(char *)((long)plVar33 + -1)));
        plVar31 = (long *)((long)plVar31 + -1)) {
      plVar33 = (long *)((long)plVar33 + -1);
      uVar28 = uVar28 + 1;
    }
  }
  else {
    sVar17 = ZSTD_count((BYTE *)((long)iend + 4),(BYTE *)((long)plVar34 + 4),(BYTE *)pInLimit);
    uVar28 = sVar17 + 4;
    uVar30 = iVar23 - (int)plVar34;
    for (; ((plVar2 < plVar34 && (src < iend)) &&
           (*(char *)((long)iend + -1) == *(char *)((long)plVar34 + -1)));
        iend = (long *)((long)iend + -1)) {
      plVar34 = (long *)((long)plVar34 + -1);
      uVar28 = uVar28 + 1;
    }
  }
LAB_0014762f:
  if (uVar27 < 4) {
    pUVar8[sVar15] = iVar25 - iVar29;
  }
  if (uVar30 == 0) goto LAB_00147b44;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00147aa9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
  uVar27 = (long)iend - (long)src;
  plVar32 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27)) goto LAB_00147ac8;
  if (pInLimit < iend) goto LAB_00147ae7;
  if (plVar1 < iend) {
    ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar1);
  }
  else {
    lVar22 = *(long *)((long)src + 8);
    *plVar32 = *src;
    plVar32[1] = lVar22;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_001477b4;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - ((long)src + 0x10))))
    goto LAB_00147b82;
    lVar22 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar22;
    if (0x20 < (long)uVar27) {
      lVar22 = 0;
      do {
        puVar5 = (undefined8 *)((long)src + lVar22 + 0x20);
        uVar12 = puVar5[1];
        pBVar3 = pBVar10 + lVar22 + 0x20;
        *(undefined8 *)pBVar3 = *puVar5;
        *(undefined8 *)(pBVar3 + 8) = uVar12;
        puVar5 = (undefined8 *)((long)src + lVar22 + 0x30);
        uVar12 = puVar5[1];
        *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
        *(undefined8 *)(pBVar3 + 0x18) = uVar12;
        lVar22 = lVar22 + 0x20;
      } while (pBVar3 + 0x20 < pBVar10 + uVar27);
    }
  }
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b63;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001477b4:
  psVar18 = seqStore->sequences;
  psVar18->litLength = (U16)uVar27;
  psVar18->offBase = uVar30 + 3;
  if (uVar28 < 3) goto LAB_00147a6b;
  uVar27 = uVar28 - 3;
  if (uVar27 < 0x10000) {
    local_d0 = local_d4;
    local_d4 = uVar30;
  }
  else {
    local_d0 = local_d4;
    local_d4 = uVar30;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b06;
LAB_001477ef:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00147813:
  iend = (long *)((long)iend + uVar28);
  psVar18->mlBase = (U16)uVar27;
  seqStore->sequences = psVar18 + 1;
  src = iend;
  if (iend <= plVar4) {
    uVar30 = UVar21 + 2;
    sVar15 = ZSTD_hash8Ptr(pBVar7 + uVar30,h);
    pUVar8[sVar15] = uVar30;
    sVar15 = ZSTD_hash8Ptr((void *)((long)iend + -2),h);
    pUVar8[sVar15] = (int)(void *)((long)iend + -2) - iVar29;
    pUVar9[(uint)(*(int *)(pBVar7 + uVar30) * -0x61c8864f) >> (bVar19 & 0x1f)] = uVar30;
    pUVar9[(uint)(*(int *)((long)iend + -1) * -0x61c8864f) >> (bVar19 & 0x1f)] =
         ((int)iend + -1) - iVar29;
    uVar30 = local_d0;
    for (; local_d0 = uVar30, src = iend, iend <= plVar4; iend = (long *)((long)iend + sVar15 + 4))
    {
      lVar22 = *iend;
      if ((local_d0 == 0) || ((int)lVar22 != *(int *)((long)iend - (ulong)local_d0))) break;
      sVar15 = ZSTD_count((BYTE *)((long)iend + 4),(BYTE *)((long)iend + (4 - (ulong)local_d0)),
                          (BYTE *)pInLimit);
      UVar21 = (int)iend - iVar29;
      pUVar9[(uint)((int)lVar22 * -0x61c8864f) >> (bVar19 & 0x1f)] = UVar21;
      sVar17 = ZSTD_hash8Ptr(iend,h);
      pUVar8[sVar17] = UVar21;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00147aa9;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
      plVar32 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar32) goto LAB_00147ac8;
      if (pInLimit < iend) goto LAB_00147ae7;
      if (plVar1 < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)iend,(BYTE *)iend,(BYTE *)plVar1);
      }
      else {
        lVar22 = iend[1];
        *plVar32 = *iend;
        plVar32[1] = lVar22;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (sVar15 + 4 < 3) goto LAB_00147a6b;
      if (0xffff < sVar15 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b06;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(sVar15 + 1);
      seqStore->sequences = psVar18 + 1;
      uVar30 = local_d4;
      local_d4 = local_d0;
    }
  }
  goto LAB_0014728e;
LAB_00145ea6:
  if ((uVar11 < pUVar8[sVar15]) && (*plVar33 == *plVar31)) {
    sVar17 = ZSTD_count((BYTE *)(plVar31 + 1),(BYTE *)(plVar33 + 1),(BYTE *)pInLimit);
    uVar28 = sVar17 + 8;
    uVar30 = iVar25 - (int)plVar33;
    for (; ((iend = plVar31, plVar2 < plVar33 && (src < plVar31)) &&
           (*(char *)((long)plVar31 + -1) == *(char *)((long)plVar33 + -1)));
        plVar31 = (long *)((long)plVar31 + -1)) {
      plVar33 = (long *)((long)plVar33 + -1);
      uVar28 = uVar28 + 1;
    }
  }
  else {
    sVar17 = ZSTD_count((BYTE *)((long)iend + 4),(BYTE *)((long)plVar34 + 4),(BYTE *)pInLimit);
    uVar28 = sVar17 + 4;
    uVar30 = iVar23 - (int)plVar34;
    for (; ((plVar2 < plVar34 && (src < iend)) &&
           (*(char *)((long)iend + -1) == *(char *)((long)plVar34 + -1)));
        iend = (long *)((long)iend + -1)) {
      plVar34 = (long *)((long)plVar34 + -1);
      uVar28 = uVar28 + 1;
    }
  }
LAB_00145f6a:
  if (uVar27 < 4) {
    pUVar8[sVar15] = iVar25 - iVar29;
  }
  if (uVar30 == 0) {
LAB_00147b44:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6dc9,
                  "size_t ZSTD_compressBlock_doubleFast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00147aa9:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00147a8a:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar27 = (long)iend - (long)src;
  plVar32 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27)) {
LAB_00147ac8:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468e,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (pInLimit < iend) {
LAB_00147ae7:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (plVar1 < iend) {
    ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)iend,(BYTE *)plVar1);
  }
  else {
    lVar22 = *(long *)((long)src + 8);
    *plVar32 = *src;
    plVar32[1] = lVar22;
    pBVar10 = seqStore->lit;
    if (uVar27 < 0x11) {
      seqStore->lit = pBVar10 + uVar27;
      goto LAB_001460f2;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar10 + 0x10) + (-0x10 - ((long)src + 0x10)))) {
LAB_00147b82:
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x36a6,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    lVar22 = *(long *)((long)src + 0x18);
    *(long *)(pBVar10 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar10 + 0x18) = lVar22;
    if (0x20 < (long)uVar27) {
      lVar22 = 0;
      do {
        puVar5 = (undefined8 *)((long)src + lVar22 + 0x20);
        uVar12 = puVar5[1];
        pBVar3 = pBVar10 + lVar22 + 0x20;
        *(undefined8 *)pBVar3 = *puVar5;
        *(undefined8 *)(pBVar3 + 8) = uVar12;
        puVar5 = (undefined8 *)((long)src + lVar22 + 0x30);
        uVar12 = puVar5[1];
        *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
        *(undefined8 *)(pBVar3 + 0x18) = uVar12;
        lVar22 = lVar22 + 0x20;
      } while (pBVar3 + 0x20 < pBVar10 + uVar27);
    }
  }
  seqStore->lit = seqStore->lit + uVar27;
  if (0xffff < uVar27) {
    if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00147b63:
      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001460f2:
  psVar18 = seqStore->sequences;
  psVar18->litLength = (U16)uVar27;
  psVar18->offBase = uVar30 + 3;
  if (uVar28 < 3) {
LAB_00147a6b:
    __assert_fail("matchLength >= MINMATCH",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x46aa,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar27 = uVar28 - 3;
  if (uVar27 < 0x10000) {
    local_d0 = local_d4;
    local_d4 = uVar30;
  }
  else {
    local_d0 = local_d4;
    local_d4 = uVar30;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b06;
LAB_0014612d:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00146151:
  iend = (long *)((long)iend + uVar28);
  psVar18->mlBase = (U16)uVar27;
  seqStore->sequences = psVar18 + 1;
  src = iend;
  if (iend <= plVar4) {
    uVar30 = UVar21 + 2;
    sVar15 = ZSTD_hash8Ptr(pBVar7 + uVar30,h);
    pUVar8[sVar15] = uVar30;
    sVar15 = ZSTD_hash8Ptr((void *)((long)iend + -2),h);
    pUVar8[sVar15] = (int)(void *)((long)iend + -2) - iVar29;
    pUVar9[(ulong)(*(long *)(pBVar7 + uVar30) * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = uVar30;
    pUVar9[(ulong)(*(long *)((long)iend + -1) * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] =
         ((int)iend + -1) - iVar29;
    uVar30 = local_d0;
    for (; local_d0 = uVar30, src = iend, iend <= plVar4; iend = (long *)((long)iend + sVar15 + 4))
    {
      if ((local_d0 == 0) || ((int)*iend != *(int *)((long)iend - (ulong)local_d0))) break;
      sVar15 = ZSTD_count((BYTE *)((long)iend + 4),(BYTE *)((long)iend + (4 - (ulong)local_d0)),
                          (BYTE *)pInLimit);
      UVar21 = (int)iend - iVar29;
      pUVar9[(ulong)(*iend * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = UVar21;
      sVar17 = ZSTD_hash8Ptr(iend,h);
      pUVar8[sVar17] = UVar21;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00147aa9;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00147a8a;
      plVar32 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar32) goto LAB_00147ac8;
      if (pInLimit < iend) goto LAB_00147ae7;
      if (plVar1 < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)iend,(BYTE *)iend,(BYTE *)plVar1);
      }
      else {
        lVar22 = iend[1];
        *plVar32 = *iend;
        plVar32[1] = lVar22;
      }
      psVar18 = seqStore->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (sVar15 + 4 < 3) goto LAB_00147a6b;
      if (0xffff < sVar15 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00147b06;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(sVar15 + 1);
      seqStore->sequences = psVar18 + 1;
      uVar30 = local_d4;
      local_d4 = local_d0;
    }
  }
  goto LAB_00145bc2;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}